

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall Game::Game(Game *this,size_t grid_width,size_t grid_height)

{
  result_type_conflict1 rVar1;
  result_type rVar2;
  result_type rVar3;
  int local_20;
  size_t grid_height_local;
  size_t grid_width_local;
  Game *this_local;
  
  grid_height_local._0_4_ = (int)grid_width;
  local_20 = (int)grid_height;
  Snake::Snake(&this->snake,(int)grid_height_local,local_20);
  Snake::Snake(&this->snake2,(int)grid_height_local,local_20);
  std::random_device::random_device(&this->dev);
  rVar1 = std::random_device::operator()(&this->dev);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->engine,(ulong)rVar1);
  std::uniform_int_distribution<int>::uniform_int_distribution
            (&this->random_w,0,(int)grid_height_local);
  std::uniform_int_distribution<int>::uniform_int_distribution(&this->random_h,0,local_20);
  this->score = 0;
  rVar2 = std::uniform_int_distribution<int>::operator()(&this->random_w,&this->engine);
  rVar3 = std::uniform_int_distribution<int>::operator()(&this->random_h,&this->engine);
  Snake::setPosition(&this->snake,(float)rVar2,(float)rVar3);
  rVar2 = std::uniform_int_distribution<int>::operator()(&this->random_w,&this->engine);
  rVar3 = std::uniform_int_distribution<int>::operator()(&this->random_h,&this->engine);
  Snake::setPosition(&this->snake2,(float)rVar2,(float)rVar3);
  PlaceFood(this);
  return;
}

Assistant:

Game::Game(std::size_t grid_width, std::size_t grid_height)
    : snake(grid_width, grid_height),
	  snake2(grid_width, grid_height),
      engine(dev()),
      random_w(0, static_cast<int>(grid_width)),
      random_h(0, static_cast<int>(grid_height)) 
{
  snake.setPosition(random_w(engine),random_h(engine));
  snake2.setPosition(random_w(engine),random_h(engine));
  PlaceFood();
}